

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

Continue __thiscall
cmCoreTryCompile::Arguments::SetSourceType(Arguments *this,string_view sourceType)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  size_t local_40;
  long *local_38;
  undefined8 local_30;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  
  local_38 = (long *)sourceType._M_str;
  local_40 = sourceType._M_len;
  if (local_40 == 10) {
    if ((short)local_38[1] == 0x454c && *local_38 == 0x55444f4d5f585843) {
      this->SourceTypeContext = CxxModule;
      return Yes;
    }
  }
  else if ((local_40 == 6) &&
          (*(short *)((long)local_38 + 4) == 0x4c41 && (int)*local_38 == 0x4d524f4e)) {
    this->SourceTypeContext = Normal;
    return Yes;
  }
  if ((this->SourceTypeError)._M_string_length == 0) {
    local_58.first._M_len = 0x17;
    local_58.first._M_str = "Invalid \'SOURCE_TYPE\' \'";
    local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_30 = 0;
    local_28 = 0x2a;
    local_20 = "\'; must be one of \'SOURCE\' or \'CXX_MODULE\'";
    local_18 = 0;
    views._M_len = 3;
    views._M_array = &local_58;
    cmCatViews(&local_78,views);
    std::__cxx11::string::operator=((string *)&this->SourceTypeError,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return Yes;
}

Assistant:

ArgumentParser::Continue cmCoreTryCompile::Arguments::SetSourceType(
  cm::string_view sourceType)
{
  bool matched = false;
  if (sourceType == "NORMAL"_s) {
    this->SourceTypeContext = SourceType::Normal;
    matched = true;
  } else if (sourceType == "CXX_MODULE"_s) {
    this->SourceTypeContext = SourceType::CxxModule;
    matched = true;
  }

  if (!matched && this->SourceTypeError.empty()) {
    // Only remember one error at a time; all other errors related to argument
    // parsing are "indicate one error and return" anyways.
    this->SourceTypeError =
      cmStrCat("Invalid 'SOURCE_TYPE' '", sourceType,
               "'; must be one of 'SOURCE' or 'CXX_MODULE'");
  }
  return ArgumentParser::Continue::Yes;
}